

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,ReadThreadsGraph_const&,int,float,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  __tuple_element_t<4UL,_tuple<type_caster<value_and_holder>,_type_caster<ReadThreadsGraph,_void>,_type_caster<int,_void>,_type_caster<float,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>_>_>
  *__n;
  vector<bool,_std::allocator<bool>_> *this_00;
  const_iterator pbVar2;
  const_iterator pbVar3;
  reference rVar4;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 uVar5;
  type_caster_generic *in_stack_fffffffffffffed8;
  handle in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff0f;
  type_caster<float,_void> *in_stack_ffffffffffffff10;
  handle in_stack_ffffffffffffff18;
  _Bit_reference in_stack_ffffffffffffff20;
  reference local_c8;
  PyObject *local_b8;
  reference local_b0;
  PyObject *local_a0;
  reference local_98;
  PyObject *local_88;
  reference local_80;
  PyObject *local_70;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x46dff9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_37 = type_caster<pybind11::detail::value_and_holder,_void>::load
                       ((type_caster<pybind11::detail::value_and_holder,_void> *)
                        in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,(bool)uVar5);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                   ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                     *)0x46e079);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_36 = type_caster_generic::load
                       (in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                        SUB81((ulong)this >> 0x38,0));
  std::
  get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x46e0fd);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_35 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)in_stack_ffffffffffffff20._M_p,
                        (PyObject *)in_stack_ffffffffffffff20._M_mask,
                        SUB81((ulong)in_stack_ffffffffffffff18.m_ptr >> 0x38,0));
  std::
  get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x46e181);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      3);
  local_88 = pvVar1->m_ptr;
  local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::_Bit_reference::operator_cast_to_bool(&local_98);
  local_34 = type_caster<float,_void>::load
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                        (bool)in_stack_ffffffffffffff0f);
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff18.m_ptr >> 0x38);
  __n = std::
        get<4ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                    *)0x46e205);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      4);
  local_a0 = pvVar1->m_ptr;
  local_b0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffef0,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_b0);
  local_33 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)in_stack_ffffffffffffff20._M_p,
                        (PyObject *)in_stack_ffffffffffffff20._M_mask,(bool)uVar5);
  this_00 = (vector<bool,_std::allocator<bool>_> *)
            std::
            get<5ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                        *)0x46e289);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      5);
  local_b8 = pvVar1->m_ptr;
  local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_c8);
  local_32 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)in_stack_ffffffffffffff20._M_p,
                        (PyObject *)in_stack_ffffffffffffff20._M_mask,(bool)uVar5);
  std::
  get<6ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<ReadThreadsGraph,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<ReadThreadsGraph,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x46e304);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),6);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff20);
  local_31 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)rVar4._M_p,(PyObject *)rVar4._M_mask,(bool)uVar5);
  local_30._M_array = &local_37;
  local_30._M_len = 7;
  local_20 = &local_30;
  pbVar2 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }